

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmTypeLiteral(ExpressionContext *ctx,VmModule *module,ExprTypeLiteral *node)

{
  TypeBase *pTVar1;
  VmValue *pVVar2;
  
  pTVar1 = node->value;
  if ((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID - 0x1a < 3)) {
    __assert_fail("!isType<TypeFunctionSet>(node->value) && !isType<TypeArgumentSet>(node->value) && !isType<TypeMemberSet>(node->value)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xa0b,
                  "VmValue *CompileVmTypeLiteral(ExpressionContext &, VmModule *, ExprTypeLiteral *)"
                 );
  }
  pVVar2 = anon_unknown.dwarf_12e14a::CreateTypeIndex
                     (module,(node->super_ExprBase).source,(TypeBase *)(ulong)pTVar1->typeIndex);
  pVVar2 = anon_unknown.dwarf_12e14a::CheckType(ctx,(ExprBase *)(node->super_ExprBase).type,pVVar2);
  return pVVar2;
}

Assistant:

VmValue* CompileVmTypeLiteral(ExpressionContext &ctx, VmModule *module, ExprTypeLiteral *node)
{
	assert(!isType<TypeFunctionSet>(node->value) && !isType<TypeArgumentSet>(node->value) && !isType<TypeMemberSet>(node->value));

	return CheckType(ctx, node, CreateTypeIndex(module, node->source, node->value));
}